

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolve.hpp
# Opt level: O0

Status __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::status(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *this)

{
  SPxStatus SVar1;
  long in_RDI;
  Status local_4;
  
  switch(*(undefined4 *)(in_RDI + 0x674)) {
  case 0:
    SVar1 = SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::status((SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)(in_RDI + 0x238));
    switch(SVar1) {
    case REGULAR:
    case DUAL:
    case PRIMAL:
      local_4 = UNKNOWN;
      break;
    case OPTIMAL:
      local_4 = OPTIMAL;
      break;
    case UNBOUNDED:
      local_4 = UNBOUNDED;
      break;
    case INFEASIBLE:
      local_4 = INFEASIBLE;
      break;
    case NO_PROBLEM:
      local_4 = NO_PROBLEM;
      break;
    case SINGULAR:
      local_4 = SINGULAR;
      break;
    default:
      local_4 = ERROR;
    }
    break;
  case 1:
  case 0xfffffff1:
  case 0xfffffff2:
  case 0xfffffff3:
  case 0xfffffff4:
  case 0xfffffff5:
  case 0xfffffff8:
  case 0xfffffff9:
  case 0xfffffffa:
  case 0xfffffffb:
  case 0xfffffffe:
  case 0xffffffff:
    local_4 = *(Status *)(in_RDI + 0x674);
    break;
  default:
    local_4 = ERROR;
    break;
  case 0xfffffffc:
    local_4 = *(Status *)(in_RDI + 0x674);
  }
  return local_4;
}

Assistant:

typename SPxSolverBase<R>::Status SPxSolverBase<R>::status() const
{
   switch(m_status)
   {
   case UNKNOWN :
      switch(SPxBasisBase<R>::status())
      {
      case SPxBasisBase<R>::NO_PROBLEM :
         return NO_PROBLEM;

      case SPxBasisBase<R>::SINGULAR :
         return SINGULAR;

      case SPxBasisBase<R>::REGULAR :
      case SPxBasisBase<R>::DUAL :
      case SPxBasisBase<R>::PRIMAL :
         return UNKNOWN;

      case SPxBasisBase<R>::OPTIMAL :
         return OPTIMAL;

      case SPxBasisBase<R>::UNBOUNDED :
         return UNBOUNDED;

      case SPxBasisBase<R>::INFEASIBLE :
         return INFEASIBLE;

      default:
         return ERROR;
      }

   case SINGULAR :
      return m_status;

   case OPTIMAL :
      assert(SPxBasisBase<R>::status() == SPxBasisBase<R>::OPTIMAL);

   /*lint -fallthrough*/
   case ABORT_CYCLING :
   case ABORT_TIME :
   case ABORT_ITER :
   case ABORT_VALUE :
   case RUNNING :
   case REGULAR :
   case NOT_INIT :
   case NO_SOLVER :
   case NO_PRICER :
   case NO_RATIOTESTER :
   case ERROR:
      return m_status;

   default:
      return ERROR;
   }
}